

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getinstanceup(HSQUIRRELVM v,SQInteger idx,SQUserPointer *p,SQUserPointer typetag)

{
  HSQUIRRELVM v_00;
  long in_RCX;
  undefined8 *in_RDX;
  SQClass *cl;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffffc8;
  long lVar1;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQRESULT local_8;
  
  v_00 = (HSQUIRRELVM)stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  if (*(int *)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0xa008000) {
    *in_RDX = *(undefined8 *)((v_00->super_SQCollectable).super_SQRefCounted._uiRef + 0x40);
    if (in_RCX == 0) {
      local_8 = 0;
    }
    else {
      lVar1 = *(long *)((v_00->super_SQCollectable).super_SQRefCounted._uiRef + 0x38);
      do {
        if (*(long *)(lVar1 + 0x1a0) == in_RCX) {
          return 0;
        }
        lVar1 = *(long *)(lVar1 + 0x38);
      } while (lVar1 != 0);
      local_8 = sq_throwerror(v_00,(SQChar *)0x0);
    }
  }
  else {
    local_8 = sq_throwerror(v_00,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getinstanceup(HSQUIRRELVM v, SQInteger idx, SQUserPointer *p,SQUserPointer typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(sq_type(o) != OT_INSTANCE) return sq_throwerror(v,_SC("the object is not a class instance"));
    (*p) = _instance(o)->_userpointer;
    if(typetag != 0) {
        SQClass *cl = _instance(o)->_class;
        do{
            if(cl->_typetag == typetag)
                return SQ_OK;
            cl = cl->_base;
        }while(cl != NULL);
        return sq_throwerror(v,_SC("invalid type tag"));
    }
    return SQ_OK;
}